

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O1

int32_t u_digit_63(UChar32 ch,int8_t radix)

{
  char cVar1;
  int32_t iVar2;
  int iVar3;
  char cVar4;
  
  cVar4 = -1;
  if ((byte)(radix - 2U) < 0x23) {
    iVar2 = u_charDigitValue_63(ch);
    cVar4 = (char)iVar2;
    if (cVar4 < '\0') {
      cVar1 = (char)ch;
      if (ch - 0x61U < 0x1a) {
        cVar4 = cVar1 + -0x57;
      }
      else if ((ch - 0x41U < 0x1a) || (ch - 0xff41U < 0x1a)) {
        cVar4 = cVar1 + -0x37;
      }
      else if (ch - 0xff21U < 0x1a) {
        cVar4 = cVar1 + -0x17;
      }
    }
  }
  iVar3 = -1;
  if ((int)cVar4 < (int)radix) {
    iVar3 = (int)cVar4;
  }
  return iVar3;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_digit(UChar32 ch, int8_t radix) {
    int8_t value;
    if((uint8_t)(radix-2)<=(36-2)) {
        value=(int8_t)u_charDigitValue(ch);
        if(value<0) {
            /* ch is not a decimal digit, try latin letters */
            if(ch>=0x61 && ch<=0x7A) {
                value=(int8_t)(ch-0x57);  /* ch - 'a' + 10 */
            } else if(ch>=0x41 && ch<=0x5A) {
                value=(int8_t)(ch-0x37);  /* ch - 'A' + 10 */
            } else if(ch>=0xFF41 && ch<=0xFF5A) {
                value=(int8_t)(ch-0xFF37);  /* fullwidth ASCII a-z */
            } else if(ch>=0xFF21 && ch<=0xFF3A) {
                value=(int8_t)(ch-0xFF17);  /* fullwidth ASCII A-Z */
            }
        }
    } else {
        value=-1;   /* invalid radix */
    }
    return (int8_t)((value<radix) ? value : -1);
}